

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O3

void chapter2::display_elem(vector<int,_std::allocator<int>_> *ivec,string *title,ostream *os)

{
  undefined8 in_RAX;
  ostream *poVar1;
  pointer piVar2;
  ulong uVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(title->_M_dataplus)._M_p,title->_M_string_length);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  piVar2 = (ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    uVar3 = 0;
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,piVar2[uVar3]);
      uStack_28._0_7_ = CONCAT16(0x20,(undefined6)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 6),1);
      uVar3 = uVar3 + 1;
      piVar2 = (ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
    } while (uVar3 < (ulong)((long)(ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

void display_elem(vector<int> &ivec, const string &title, ostream &os) {
        os << title << '\n';
        for (int ix = 0; ix < ivec.size(); ++ix) {
            os << ivec[ix] << ' ';
        }

        os << endl;
    }